

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uidgid.c
# Opt level: O1

uint uidgids_set(uidgid *u,char *ug)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  char *s;
  char *pcVar5;
  unsigned_long id;
  uid_t local_30 [2];
  
  uVar2 = scan_ulong(ug,(unsigned_long *)local_30);
  uVar3 = 0;
  if (ug[uVar2] == ':') {
    u->uid = local_30[0];
    s = ug + (ulong)uVar2 + 1;
    lVar4 = 1;
    do {
      uVar3 = scan_ulong(s,(unsigned_long *)local_30);
      pcVar5 = s + uVar3;
      u->gid[lVar4 + -1] = local_30[0];
      pcVar1 = s + uVar3;
      s = pcVar5;
      if (*pcVar1 != ':') goto LAB_00105e46;
      s = pcVar5 + 1;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x3d);
    lVar4 = 0x3c;
LAB_00105e46:
    u->gid[(int)lVar4] = 0;
    u->gids = (int)lVar4;
    uVar3 = (uint)(*s == '\0');
  }
  return uVar3;
}

Assistant:

unsigned int uidgids_set(struct uidgid *u, char *ug) {
  unsigned long id;
  int i;

  if (*(ug +=scan_ulong(ug, &id)) != ':') return(0);
  u->uid =(uid_t)id;
  ++ug;
  for (i =0; i < 60; ++i, ++ug) {
    ug +=scan_ulong(ug, &id);
    u->gid[i] =(gid_t)id;
    if (*ug != ':') { ++i; break; }
  }
  u->gid[i] =0;
  u->gids =i;
  if (*ug) return(0);
  return(1);
}